

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase *
CreateExtract(ExpressionEvalContext *ctx,ExprMemoryLiteral *memory,uint offset,TypeBase *type)

{
  SynBase *source;
  TypeRef *type_00;
  ExprBase *pEVar1;
  uchar *ptr;
  undefined1 local_68 [8];
  ExprPointerLiteral addr;
  TypeBase *type_local;
  uint offset_local;
  ExprMemoryLiteral *memory_local;
  ExpressionEvalContext *ctx_local;
  
  addr.end = (uchar *)type;
  if (memory->ptr->ptr + type->size <= memory->ptr->end) {
    source = (memory->super_ExprBase).source;
    type_00 = ExpressionContext::GetReferenceType(ctx->ctx,type);
    ptr = memory->ptr->ptr + offset;
    ExprPointerLiteral::ExprPointerLiteral
              ((ExprPointerLiteral *)local_68,source,&type_00->super_TypeBase,ptr,
               ptr + *(long *)(addr.end + 0x30));
    pEVar1 = CreateLoad(ctx,(ExprBase *)local_68);
    ExprPointerLiteral::~ExprPointerLiteral((ExprPointerLiteral *)local_68);
    return pEVar1;
  }
  __assert_fail("memory->ptr->ptr + type->size <= memory->ptr->end",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                ,0x1a9,
                "ExprBase *CreateExtract(ExpressionEvalContext &, ExprMemoryLiteral *, unsigned int, TypeBase *)"
               );
}

Assistant:

ExprBase* CreateExtract(ExpressionEvalContext &ctx, ExprMemoryLiteral *memory, unsigned offset, TypeBase *type)
{
	assert(memory->ptr->ptr + type->size <= memory->ptr->end);

	ExprPointerLiteral addr(memory->source, ctx.ctx.GetReferenceType(type), memory->ptr->ptr + offset, memory->ptr->ptr + offset + type->size);

	return CreateLoad(ctx, &addr);
}